

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O2

bool __thiscall BoxNesting::KuhnAlgorithm::kuhn(KuhnAlgorithm *this,int16_t vertex)

{
  short sVar1;
  pointer pvVar2;
  pointer psVar3;
  long lVar4;
  bool bVar5;
  pointer psVar6;
  size_type __n;
  undefined6 in_register_00000032;
  short sVar7;
  reference rVar8;
  
  __n = (size_type)(int)CONCAT62(in_register_00000032,vertex);
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used,__n);
  if ((*rVar8._M_p & rVar8._M_mask) == 0) {
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used,__n);
    *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
    pvVar2 = (this->graph).
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = *(pointer *)
              ((long)&pvVar2[__n].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8);
    lVar4 = *(long *)&pvVar2[__n].super__Vector_base<short,_std::allocator<short>_>._M_impl;
    sVar7 = 0;
    do {
      if ((ulong)((long)psVar3 - lVar4 >> 1) <= (ulong)(long)sVar7) goto LAB_00111f87;
      psVar6 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar1 = *(short *)(*(long *)&(this->graph).
                                   super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[__n].
                                   super__Vector_base<short,_std::allocator<short>_>._M_impl +
                        (long)sVar7 * 2);
      if (psVar6[sVar1] == -1) goto LAB_00111fec;
      bVar5 = kuhn(this,psVar6[sVar1]);
      sVar7 = sVar7 + 1;
    } while (!bVar5);
    psVar6 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_00111fec:
    psVar6[sVar1] = vertex;
    (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = sVar1;
    bVar5 = true;
  }
  else {
LAB_00111f87:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool KuhnAlgorithm::kuhn(int16_t vertex) const
{
	if (this->used[vertex]) {
		return false;
	}
	this->used[vertex] = true;

	auto sz = this->graph[vertex].size();
	for (int16_t i = 0; i < sz; ++i) {
		auto to = this->graph[vertex][i];
		if (this->pairsRight[to] == -1 || kuhn(this->pairsRight[to])) {
			this->pairsRight[to] = vertex;
			this->pairsLeft[vertex] = to;
			return true;
		}
	}
	return false;
}